

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O0

ion_status_t sl_insert(ion_skiplist_t *skiplist,ion_key_t key,ion_value_t value)

{
  int iVar1;
  int iVar2;
  ion_status_t iVar3;
  char cVar4;
  ion_sl_level_t iVar5;
  sl_node *__ptr;
  void *pvVar6;
  sl_node **ppsVar7;
  bool bVar8;
  int local_4c;
  sl_node *psStack_48;
  ion_sl_level_t h;
  ion_sl_node_t *cursor;
  ion_sl_node_t *duplicate;
  ion_sl_node_t *newnode;
  ion_value_size_t value_size;
  ion_key_size_t key_size;
  ion_value_t value_local;
  ion_key_t key_local;
  ion_skiplist_t *skiplist_local;
  
  iVar1 = (skiplist->super).record.key_size;
  iVar2 = (skiplist->super).record.value_size;
  __ptr = (sl_node *)malloc(0x20);
  if (__ptr == (sl_node *)0x0) {
    skiplist_local._0_4_ = CONCAT31(skiplist_local._1_3_,6);
    skiplist_local._4_4_ = 0;
  }
  else {
    pvVar6 = malloc((long)iVar1);
    __ptr->key = pvVar6;
    if (__ptr->key == (ion_key_t)0x0) {
      free(__ptr);
      skiplist_local._0_4_ = CONCAT31(skiplist_local._1_3_,6);
      skiplist_local._4_4_ = 0;
    }
    else {
      pvVar6 = malloc((long)iVar2);
      __ptr->value = pvVar6;
      if (__ptr->value == (ion_value_t)0x0) {
        free(__ptr->key);
        free(__ptr);
        skiplist_local._0_4_ = CONCAT31(skiplist_local._1_3_,6);
        skiplist_local._4_4_ = 0;
      }
      else {
        memcpy(__ptr->key,key,(long)iVar1);
        memcpy(__ptr->value,value,(long)iVar2);
        cursor = sl_find_node(skiplist,key);
        if ((cursor->key == (ion_key_t)0x0) ||
           (cVar4 = (*(skiplist->super).compare)(cursor->key,key,iVar1), cVar4 != '\0')) {
          iVar5 = sl_gen_level(skiplist);
          __ptr->height = iVar5;
          ppsVar7 = (sl_node **)malloc((long)(__ptr->height + 1) << 3);
          __ptr->next = ppsVar7;
          if (__ptr->next == (sl_node **)0x0) {
            free(__ptr->value);
            free(__ptr->key);
            free(__ptr);
            skiplist_local._0_4_ = CONCAT31(skiplist_local._1_3_,6);
            skiplist_local._4_4_ = 0;
            goto LAB_00107f02;
          }
          psStack_48 = skiplist->head;
          for (local_4c = skiplist->head->height; -1 < local_4c; local_4c = local_4c + -1) {
            while( true ) {
              bVar8 = false;
              if (psStack_48->next[local_4c] != (sl_node *)0x0) {
                cVar4 = (*(skiplist->super).compare)(key,psStack_48->next[local_4c]->key,iVar1);
                bVar8 = -1 < cVar4;
              }
              if (!bVar8) break;
              psStack_48 = psStack_48->next[local_4c];
            }
            if (local_4c <= __ptr->height) {
              __ptr->next[local_4c] = psStack_48->next[local_4c];
              psStack_48->next[local_4c] = __ptr;
            }
          }
        }
        else {
          __ptr->height = 0;
          ppsVar7 = (sl_node **)malloc((long)(__ptr->height + 1) << 3);
          __ptr->next = ppsVar7;
          if (__ptr->next == (sl_node **)0x0) {
            free(__ptr->value);
            free(__ptr->key);
            free(__ptr);
            skiplist_local._0_4_ = CONCAT31(skiplist_local._1_3_,6);
            skiplist_local._4_4_ = 0;
            goto LAB_00107f02;
          }
          while( true ) {
            bVar8 = false;
            if (*cursor->next != (sl_node *)0x0) {
              cVar4 = (*(skiplist->super).compare)((*cursor->next)->key,key,iVar1);
              bVar8 = cVar4 == '\0';
            }
            if (!bVar8) break;
            cursor = *cursor->next;
          }
          *__ptr->next = *cursor->next;
          *cursor->next = __ptr;
        }
        skiplist_local._0_4_ = (uint)skiplist_local & 0xffffff00;
        skiplist_local._4_4_ = 1;
      }
    }
  }
LAB_00107f02:
  iVar3.count = skiplist_local._4_4_;
  iVar3._0_4_ = (uint)skiplist_local;
  return iVar3;
}

Assistant:

ion_status_t
sl_insert(
	ion_skiplist_t	*skiplist,
	ion_key_t		key,
	ion_value_t		value
) {
	ion_key_size_t		key_size	= skiplist->super.record.key_size;
	ion_value_size_t	value_size	= skiplist->super.record.value_size;

	ion_sl_node_t *newnode			= malloc(sizeof(ion_sl_node_t));

	if (NULL == newnode) {
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->key = malloc((size_t) key_size);

	if (NULL == newnode->key) {
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	newnode->value = malloc((size_t) value_size);

	if (NULL == newnode->value) {
		free(newnode->key);
		free(newnode);
		return ION_STATUS_ERROR(err_out_of_memory);
	}

	memcpy(newnode->key, key, key_size);
	memcpy(newnode->value, value, value_size);

	/* First we check if there's already a duplicate node. If there is, we're
	   going to do a modified insert instead. */
	ion_sl_node_t *duplicate = sl_find_node(skiplist, key);

	if ((NULL != duplicate->key) && (skiplist->super.compare(duplicate->key, key, key_size) == 0)) {
		/* Child duplicate nodes have no height (which is effectively 1). */
		newnode->height = 0;
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		/* We want duplicate to be the last node in the block of duplicate
		 * nodes, so we traverse along the bottom until we get there.
		*/
		while (NULL != duplicate->next[0] && skiplist->super.compare(duplicate->next[0]->key, key, key_size) == 0) {
			duplicate = duplicate->next[0];
		}

		/* Only one height to worry about */
		newnode->next[0]	= duplicate->next[0];
		duplicate->next[0]	= newnode;
	}
	else {
		/* If there's no duplicate node, we do a vanilla insert instead */
		newnode->height = sl_gen_level(skiplist);
		newnode->next	= malloc(sizeof(ion_sl_node_t *) * (newnode->height + 1));

		if (NULL == newnode->next) {
			free(newnode->value);
			free(newnode->key);
			free(newnode);
			return ION_STATUS_ERROR(err_out_of_memory);
		}

		ion_sl_node_t	*cursor = skiplist->head;
		ion_sl_level_t	h;

		for (h = skiplist->head->height; h >= 0; --h) {
			/* The memcmp will return -1 if key is smaller, 0 if equal, 1 if greater. */
			while (NULL != cursor->next[h] && skiplist->super.compare(key, cursor->next[h]->key, key_size) >= 0) {
				cursor = cursor->next[h];
			}

			if (h <= newnode->height) {
				newnode->next[h]	= cursor->next[h];
				cursor->next[h]		= newnode;
			}
		}
	}

	return ION_STATUS_OK(1);
}